

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
ON_TextureMapping::SetCustomMappingPrimitive(ON_TextureMapping *this,ON_Object *pMappingObject)

{
  ON_Object *pOVar1;
  MappingCRCCache *this_00;
  ON_UUID local_38;
  ON_UserData *local_28;
  MappingCRCCache *pUD;
  ON_Object *pOStack_18;
  ON__UINT32 mapping_crc;
  ON_Object *pMappingObject_local;
  ON_TextureMapping *this_local;
  
  pOStack_18 = pMappingObject;
  pMappingObject_local = (ON_Object *)this;
  if (pMappingObject != (ON_Object *)0x0) {
    pUD._4_4_ = ::MappingCRC(pMappingObject);
    pOVar1 = pOStack_18;
    local_38 = ON_ClassId::Uuid(&MappingCRCCache::m_MappingCRCCache_class_rtti);
    local_28 = ON_Object::GetUserData(pOVar1,&local_38);
    pOVar1 = pOStack_18;
    if (local_28 != (ON_UserData *)0x0) {
      *(ON__UINT32 *)&local_28[1].super_ON_Object._vptr_ON_Object = pUD._4_4_;
    }
    this_00 = (MappingCRCCache *)operator_new(0xd0);
    MappingCRCCache::MappingCRCCache(this_00,pUD._4_4_);
    ON_Object::AttachUserData(pOVar1,(ON_UserData *)this_00);
  }
  std::__shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Object>
            (&(this->m_mapping_primitive).
              super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>,pOStack_18);
  return;
}

Assistant:

void ON_TextureMapping::SetCustomMappingPrimitive(ON_Object* pMappingObject)
{
  if (nullptr != pMappingObject)
  {
    const auto mapping_crc = ::MappingCRC(pMappingObject);

    if (auto* pUD = static_cast<MappingCRCCache*>(pMappingObject->GetUserData(ON_CLASS_ID(MappingCRCCache))))
    {
      pUD->m_mapping_crc = mapping_crc;
    }

    pMappingObject->AttachUserData(new MappingCRCCache(mapping_crc));
  }

  m_mapping_primitive.reset(pMappingObject);
}